

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O0

Vector * AddAsgn_VV(Vector *V1,Vector *V2)

{
  double dVar1;
  Real *pRVar2;
  Real *pRVar3;
  Real *pRVar4;
  LASErrIdType LVar5;
  char *pcVar6;
  char *pcVar7;
  Real *V2Cmp;
  Real *V1Cmp;
  size_t Ind;
  size_t Dim;
  double Multipl;
  Vector *VRes;
  Vector *V2_local;
  Vector *V1_local;
  
  V_Lock(V1);
  V_Lock(V2);
  LVar5 = LASResult();
  if (LVar5 == LASOK) {
    if ((V1->Instance == Normal) && (V1->Dim == V2->Dim)) {
      pRVar2 = (Real *)V1->Dim;
      pRVar3 = V1->Cmp;
      pRVar4 = V2->Cmp;
      Multipl = (double)V1;
      if (2.220446049250313e-15 <= ABS(V2->Multipl - 1.0)) {
        dVar1 = V2->Multipl;
        for (V1Cmp = (Real *)0x1; V1Cmp <= pRVar2; V1Cmp = (Real *)((long)V1Cmp + 1)) {
          pRVar3[(long)V1Cmp] = dVar1 * pRVar4[(long)V1Cmp] + pRVar3[(long)V1Cmp];
        }
      }
      else {
        for (V1Cmp = (Real *)0x1; V1Cmp <= pRVar2; V1Cmp = (Real *)((long)V1Cmp + 1)) {
          pRVar3[(long)V1Cmp] = pRVar4[(long)V1Cmp] + pRVar3[(long)V1Cmp];
        }
      }
    }
    else {
      if (V1->Instance != Normal) {
        pcVar6 = V_GetName(V1);
        pcVar7 = V_GetName(V2);
        LASError(LASLValErr,"AddAsgn_VV",pcVar6,pcVar7,(char *)0x0);
      }
      if (V1->Dim != V2->Dim) {
        pcVar6 = V_GetName(V1);
        pcVar7 = V_GetName(V2);
        LASError(LASDimErr,"AddAsgn_VV",pcVar6,pcVar7,(char *)0x0);
      }
      Multipl = 0.0;
    }
  }
  else {
    Multipl = 0.0;
  }
  V_Unlock(V1);
  V_Unlock(V2);
  return (Vector *)Multipl;
}

Assistant:

Vector *AddAsgn_VV(Vector *V1, Vector *V2)
/* VRes = V1 += V2 */
{
    Vector *VRes;

    double Multipl;
    size_t Dim, Ind;
    Real *V1Cmp, *V2Cmp;

    V_Lock(V1);
    V_Lock(V2);
    
    if (LASResult() == LASOK) {
        if (V1->Instance == Normal && V1->Dim == V2->Dim) {
            Dim = V1->Dim;
            V1Cmp = V1->Cmp;
            V2Cmp = V2->Cmp;
            if (IsOne(V2->Multipl)) {
               for_AllCmp
                    V1Cmp[Ind] += V2Cmp[Ind];
            } else {
                Multipl = V2->Multipl;
                for_AllCmp
                    V1Cmp[Ind] += Multipl * V2Cmp[Ind];
            }
            VRes = V1;
        } else {
            if (V1->Instance != Normal)
                LASError(LASLValErr, "AddAsgn_VV", V_GetName(V1), V_GetName(V2), NULL);
            if (V1->Dim != V2->Dim) 
                LASError(LASDimErr, "AddAsgn_VV", V_GetName(V1), V_GetName(V2), NULL);
            VRes = NULL;
        }
    } else {
        VRes = NULL;
    }

    V_Unlock(V1);
    V_Unlock(V2);

    return(VRes);
}